

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O2

cio_error cio_linux_eventloop_add(cio_eventloop *loop,cio_event_notifier *evn)

{
  int iVar1;
  cio_error cVar2;
  int *piVar3;
  epoll_event epoll_ev;
  
  evn->registered_events = 0;
  epoll_ev.events = 0;
  epoll_ev.data = (epoll_data_t)evn;
  iVar1 = epoll_ctl(loop->epoll_fd,1,evn->fd,(epoll_event *)&epoll_ev);
  cVar2 = CIO_SUCCESS;
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    cVar2 = -*piVar3;
  }
  return cVar2;
}

Assistant:

enum cio_error cio_linux_eventloop_add(const struct cio_eventloop *loop, struct cio_event_notifier *evn)
{
	struct epoll_event epoll_ev;
	evn->registered_events = 0;

	epoll_ev.data.ptr = evn;
	epoll_ev.events = evn->registered_events;
	if (cio_unlikely(epoll_ctl(loop->epoll_fd, EPOLL_CTL_ADD, evn->fd, &epoll_ev) < 0)) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}